

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O2

int __thiscall ncnn::YoloDetectionOutput::load_param(YoloDetectionOutput *this,ParamDict *pd)

{
  int iVar1;
  float fVar2;
  Mat MStack_98;
  Mat local_58;
  
  iVar1 = ParamDict::get(pd,0,0x14);
  this->num_class = iVar1;
  iVar1 = ParamDict::get(pd,1,5);
  this->num_box = iVar1;
  fVar2 = ParamDict::get(pd,2,0.01);
  this->confidence_threshold = fVar2;
  fVar2 = ParamDict::get(pd,3,0.45);
  this->nms_threshold = fVar2;
  local_58.elemsize._0_4_ = 0;
  local_58._20_8_ = 0;
  local_58.data = (void *)0x0;
  local_58.refcount._0_4_ = 0;
  local_58.refcount._4_4_ = 0;
  local_58.allocator = (Allocator *)0x0;
  local_58.dims = 0;
  local_58.w = 0;
  local_58.h = 0;
  local_58.c = 0;
  local_58.cstep = 0;
  ParamDict::get(&MStack_98,pd,4,&local_58);
  Mat::operator=(&this->biases,&MStack_98);
  Mat::~Mat(&MStack_98);
  Mat::~Mat(&local_58);
  return 0;
}

Assistant:

int YoloDetectionOutput::load_param(const ParamDict& pd)
{
    num_class = pd.get(0, 20);
    num_box = pd.get(1, 5);
    confidence_threshold = pd.get(2, 0.01f);
    nms_threshold = pd.get(3, 0.45f);
    biases = pd.get(4, Mat());

    return 0;
}